

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xorfilter.h
# Opt level: O2

uint32_t xor_flushone_decrement_buffer
                   (xor_setbuffer_t *buffer,xor_xorset_t *sets,xor_keyindex_t *Q,size_t *Qsize)

{
  ulong uVar1;
  ulong uVar2;
  uint32_t uVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  size_t sVar7;
  uint32_t slot;
  ulong uVar8;
  ulong uVar9;
  ulong uVar10;
  
  puVar6 = buffer->counts;
  uVar4 = *puVar6;
  uVar5 = 0;
  for (uVar8 = 1; uVar8 < buffer->slotcount; uVar8 = uVar8 + 1) {
    if (uVar4 < puVar6[uVar8]) {
      uVar5 = uVar8 & 0xffffffff;
      uVar4 = puVar6[uVar8];
    }
  }
  sVar7 = *Qsize;
  uVar4 = (int)uVar5 << ((byte)buffer->insignificantbits & 0x1f);
  uVar2 = (ulong)uVar4;
  uVar8 = uVar2 << 4 | 8;
  for (; uVar2 < puVar6[uVar5] + uVar4; uVar2 = uVar2 + 1) {
    uVar1 = *(ulong *)((long)&buffer->buffer->hash + uVar8);
    uVar9 = uVar1 & 0xffffffff;
    uVar10 = sets[uVar9].xormask ^ *(ulong *)((long)buffer->buffer + (uVar8 - 8));
    sets[uVar9].xormask = uVar10;
    uVar3 = sets[uVar9].count - 1;
    sets[uVar9].count = uVar3;
    if (uVar3 == 1) {
      Q[sVar7].hash = uVar10;
      *(ulong *)&Q[sVar7].index = uVar1;
      sVar7 = sVar7 + 1;
      puVar6 = buffer->counts;
    }
    uVar8 = uVar8 + 0x10;
  }
  *Qsize = sVar7;
  puVar6[uVar5] = 0;
  return (uint32_t)Qsize;
}

Assistant:

static inline uint32_t xor_flushone_decrement_buffer(xor_setbuffer_t *buffer,
                                                     xor_xorset_t *sets,
                                                     xor_keyindex_t *Q,
                                                     size_t *Qsize) {
  uint32_t bestslot = 0;
  uint32_t bestcount = buffer->counts[bestslot];
  for (uint32_t slot = 1; slot < buffer->slotcount; slot++) {
    if (buffer->counts[slot] > bestcount) {
      bestslot = slot;
      bestcount = buffer->counts[slot];
    }
  }
  uint32_t slot = bestslot;
  size_t qsize = *Qsize;
  // for(uint32_t slot = 0; slot < buffer->slotcount; slot++) {
  uint32_t base = (slot << (uint32_t)buffer->insignificantbits);
  for (size_t i = base; i < buffer->counts[slot] + base; i++) {
    xor_keyindex_t ki = buffer->buffer[i];
    sets[ki.index].xormask ^= ki.hash;
    sets[ki.index].count--;
    if (sets[ki.index].count == 1) {
      ki.hash = sets[ki.index].xormask;
      Q[qsize] = ki;
      qsize += 1;
    }
  }
  *Qsize = qsize;
  buffer->counts[slot] = 0;
  //}
  return bestslot;
}